

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

int If_DsdManAddDsd_rec(char *pStr,char **p,int *pMatches,If_DsdMan_t *pMan,word *pTruth,
                       uchar *pPerm,int *pnSupp)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  byte *pbVar7;
  uint c;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  int pLits_1 [12];
  int pLits [12];
  
  iVar5 = *pnSupp;
  pbVar7 = (byte *)*p;
  bVar1 = *pbVar7;
  bVar11 = bVar1 == 0x21;
  pbVar8 = pbVar7;
  if (bVar11) {
    pbVar8 = pbVar7 + 1;
    *p = (char *)pbVar8;
    bVar1 = pbVar7[1];
  }
  c = (uint)bVar11;
  if ((byte)(bVar1 + 0x9f) < 0x1a) {
    iVar3 = Abc_Var2Lit((uint)(byte)(bVar1 + 0x9f),c);
    iVar5 = *pnSupp;
    *pnSupp = iVar5 + 1;
    pPerm[iVar5] = (uchar)iVar3;
    return 2;
  }
  if (((bVar1 - 0x3c < 0x40) && ((0x8000000080000001U >> ((ulong)(bVar1 - 0x3c) & 0x3f) & 1) != 0))
     || (bVar1 == 0x28)) {
    if (bVar1 == 0x28) {
      iVar3 = 3;
    }
    else if (bVar1 == 0x3c) {
      iVar3 = 5;
    }
    else if (bVar1 == 0x7b) {
      iVar3 = 6;
    }
    else {
      if (bVar1 != 0x5b) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                      ,0x69b,
                      "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                     );
      }
      iVar3 = 4;
    }
    pbVar7 = (byte *)(pStr + pMatches[(long)pbVar8 - (long)pStr]);
    if ((uint)bVar1 + (uint)(bVar1 != 0x28) + 1 == (int)(char)*pbVar7) {
      lVar10 = 0;
      while( true ) {
        pbVar8 = pbVar8 + 1;
        *p = (char *)pbVar8;
        if (pbVar7 <= pbVar8) break;
        iVar4 = If_DsdManAddDsd_rec(pStr,p,pMatches,pMan,pTruth,pPerm,pnSupp);
        pLits[lVar10] = iVar4;
        lVar10 = lVar10 + 1;
        pbVar8 = (byte *)*p;
      }
      if (pbVar8 == pbVar7) {
        iVar5 = If_DsdManOperation(pMan,iVar3,pLits,(int)lVar10,pPerm + iVar5,pTruth);
        iVar5 = Abc_LitNotCond(iVar5,c);
        return iVar5;
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x69f,
                    "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                   );
    }
    __assert_fail("*q == **p + 1 + (**p != \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x69c,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  if (5 < (byte)(bVar1 + 0xbf) && 9 < (byte)(bVar1 - 0x30)) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6b3,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  pbVar7 = pbVar8;
  if (bVar1 == 0x30) {
    pbVar7 = pbVar8 + (ulong)(pbVar8[1] == 0x78) * 2;
  }
  iVar3 = 1;
  iVar4 = 2;
  uVar9 = 0xffffffffffffffff;
  lVar10 = -0x100000000;
  do {
    do {
      lVar2 = uVar9 + 1;
      iVar4 = iVar4 + -1;
      uVar9 = uVar9 + 1;
      lVar10 = lVar10 + 0x100000000;
    } while (0xf5 < (byte)(pbVar7[lVar2] - 0x3a));
  } while (0xf9 < (byte)((pbVar7[lVar2] & 0xdf) + 0xb9));
  if (iVar4 == 0) {
    bVar1 = *pbVar7;
    if (bVar1 != 0x46) {
      if ((bVar1 == 0x35) || (bVar1 == 0x41)) {
        pLits[0] = -0x55555556;
        pLits[1] = -0x55555556;
        if (bVar1 == 0x35) {
          pLits[0] = 0x55555555;
          pLits[1] = 0x55555555;
        }
        goto LAB_00389e9f;
      }
      if (bVar1 != 0x30) {
        uVar6 = 1;
        iVar3 = 2;
        goto LAB_00389e09;
      }
    }
    pLits._0_8_ = -(ulong)(bVar1 != 0x30);
    iVar3 = 0;
  }
  else {
    iVar4 = Abc_Base2Log((uint)uVar9);
    iVar3 = iVar4 + 2;
    uVar6 = (ulong)(uint)(1 << ((char)iVar4 - 4U & 0x1f));
    if (iVar4 < 5) {
      uVar6 = 1;
    }
LAB_00389e09:
    for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      (pLits + uVar6 * 2 + -2)[0] = 0;
      (pLits + uVar6 * 2 + -2)[1] = 0;
    }
    for (uVar6 = 0; uVar6 != (uVar9 & 0xffffffff); uVar6 = uVar6 + 1) {
      bVar1 = pbVar7[~uVar6 + (lVar10 >> 0x20)];
      iVar4 = -0x30;
      if (((9 < (byte)(bVar1 - 0x30)) && (iVar4 = -0x37, 5 < (byte)(bVar1 + 0xbf))) &&
         (iVar4 = -0x57, 5 < (byte)(bVar1 + 0x9f))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                      ,0x4bf,"int Abc_TtReadHexDigit(char)");
      }
      *(ulong *)(pLits + (uVar6 >> 4 & 0xfffffff) * 2) =
           *(ulong *)(pLits + (uVar6 >> 4 & 0xfffffff) * 2) |
           (ulong)(iVar4 + (uint)bVar1) << ((char)uVar6 * '\x04' & 0x3fU);
    }
    if (iVar3 < 6) {
      pLits._0_8_ = Abc_Tt6Stretch(pLits._0_8_,iVar3);
      pbVar8 = (byte *)*p;
    }
  }
LAB_00389e9f:
  iVar4 = 1 << ((char)iVar3 - 2U & 0x1f);
  if (iVar3 < 3) {
    iVar4 = 1;
  }
  pbVar7 = pbVar8 + iVar4;
  *p = (char *)pbVar7;
  if ((pbVar8[iVar4] == 0x7b) &&
     (pbVar8 = (byte *)(pStr + pMatches[(long)pbVar7 - (long)pStr]), *pbVar8 == 0x7d)) {
    lVar10 = 0;
    while( true ) {
      pbVar7 = pbVar7 + 1;
      *p = (char *)pbVar7;
      if (pbVar8 <= pbVar7) break;
      iVar4 = If_DsdManAddDsd_rec(pStr,p,pMatches,pMan,pTruth,pPerm,pnSupp);
      pLits_1[lVar10] = iVar4;
      lVar10 = lVar10 + 1;
      pbVar7 = (byte *)*p;
    }
    if (iVar3 == (int)lVar10) {
      if (pbVar7 == pbVar8) {
        iVar5 = If_DsdManOperation(pMan,6,pLits_1,iVar3,pPerm + iVar5,(word *)pLits);
        iVar5 = Abc_LitNotCond(iVar5,c);
        return iVar5;
      }
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                    ,0x6af,
                    "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                   );
    }
    __assert_fail("i == nVarsF",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x6ae,
                  "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
                 );
  }
  __assert_fail("**p == \'{\' && *q == \'}\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                ,0x6ab,
                "int If_DsdManAddDsd_rec(char *, char **, int *, If_DsdMan_t *, word *, unsigned char *, int *)"
               );
}

Assistant:

int If_DsdManAddDsd_rec( char * pStr, char ** p, int * pMatches, If_DsdMan_t * pMan, word * pTruth, unsigned char * pPerm, int * pnSupp )
{
    unsigned char * pPermStart = pPerm + *pnSupp;
    int iRes = -1, fCompl = 0;
    if ( **p == '!' )
    {
        fCompl = 1;
        (*p)++;
    }
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        pPerm[(*pnSupp)++] = Abc_Var2Lit( **p - 'a', fCompl );
        return 2;
    }
    if ( **p == '(' || **p == '[' || **p == '<' || **p == '{' ) // and/or/xor
    {
        int Type = 0, nLits = 0, pLits[DAU_MAX_VAR];
        char * q = pStr + pMatches[ *p - pStr ];
        if ( **p == '(' )
            Type = DAU_DSD_AND;
        else if ( **p == '[' )
            Type = DAU_DSD_XOR;
        else if ( **p == '<' )
            Type = DAU_DSD_MUX;
        else if ( **p == '{' )
            Type = DAU_DSD_PRIME;
        else assert( 0 );
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
            pLits[nLits++] = If_DsdManAddDsd_rec( pStr, p, pMatches, pMan, pTruth, pPerm, pnSupp );
        assert( *p == q );
        iRes = If_DsdManOperation( pMan, Type, pLits, nLits, pPermStart, pTruth );
        return Abc_LitNotCond( iRes, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word pFunc[DAU_MAX_WORD];
        int nLits = 0, pLits[DAU_MAX_VAR];
        char * q;
        int i, nVarsF = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVarsF );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            pLits[nLits++] = If_DsdManAddDsd_rec( pStr, p, pMatches, pMan, pTruth, pPerm, pnSupp );
        assert( i == nVarsF );
        assert( *p == q );
        iRes = If_DsdManOperation( pMan, DAU_DSD_PRIME, pLits, nLits, pPermStart, pFunc );
        return Abc_LitNotCond( iRes, fCompl );
    }
    assert( 0 );
    return -1;
}